

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_compressBlock_doubleFast_dictMatchState_7
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  uint uVar1;
  U32 *pUVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  ZSTD_matchState_t *pZVar5;
  U32 *pUVar6;
  U32 *pUVar7;
  BYTE *pBVar8;
  BYTE *pBVar9;
  long lVar10;
  int iVar11;
  U32 UVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  U32 UVar16;
  uint uVar17;
  U32 UVar18;
  U32 UVar19;
  uint uVar20;
  uint uVar21;
  BYTE *pBVar22;
  BYTE *pBVar23;
  BYTE *pBVar24;
  BYTE *pBVar25;
  size_t sVar26;
  size_t sVar27;
  U64 UVar28;
  U64 UVar29;
  BYTE *in_RCX;
  int *in_RDX;
  void *pvVar30;
  long *in_RSI;
  ulong uVar31;
  ZSTD_matchState_t *in_RDI;
  long in_R8;
  bool bVar32;
  U32 tmpOffset;
  size_t repLength2;
  BYTE *repEnd2;
  BYTE *repMatch2;
  U32 repIndex2;
  U32 current2;
  U32 indexToInsert;
  BYTE *dictMatchL3;
  U32 dictMatchIndexL3;
  BYTE *matchL3;
  int dictTagsMatchL3;
  U32 dictMatchIndexAndTagL3;
  U32 matchIndexL3;
  size_t dictHashAndTagL3;
  size_t hl3;
  U32 dictMatchIndexS;
  BYTE *dictMatchL;
  U32 dictMatchIndexL;
  BYTE *repMatchEnd;
  BYTE *repMatch;
  U32 repIndex;
  BYTE *match;
  BYTE *matchLong;
  U32 matchIndexS;
  U32 matchIndexL;
  U32 curr;
  int dictTagsMatchS;
  int dictTagsMatchL;
  U32 dictMatchIndexAndTagS;
  U32 dictMatchIndexAndTagL;
  size_t dictHashAndTagS;
  size_t dictHashAndTagL;
  size_t h;
  size_t h2;
  U32 offset;
  size_t mLength;
  size_t _pos_1;
  size_t _size_1;
  char *_ptr_1;
  size_t _pos;
  size_t _size;
  char *_ptr;
  size_t chainTableBytes;
  size_t hashTableBytes;
  U32 dictAndPrefixLength;
  U32 dictHBitsS;
  U32 dictHBitsL;
  U32 dictIndexDelta;
  BYTE *dictEnd;
  BYTE *dictStart;
  BYTE *dictBase;
  U32 dictStartIndex;
  U32 *dictHashSmall;
  U32 *dictHashLong;
  ZSTD_compressionParameters *dictCParams;
  ZSTD_matchState_t *dms;
  U32 offset_2;
  U32 offset_1;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *prefixLowest;
  U32 prefixLowestIndex;
  U32 endIndex;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  BYTE *base;
  U32 hBitsS;
  U32 *hashSmall;
  U32 hBitsL;
  U32 *hashLong;
  ZSTD_compressionParameters *cParams;
  size_t mlBase_2;
  BYTE *litEnd_2;
  BYTE *litLimit_w_2;
  size_t mlBase_1;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  size_t mlBase;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_3;
  ptrdiff_t diff_2;
  undefined4 in_stack_fffffffffffff9b8;
  U32 in_stack_fffffffffffff9bc;
  undefined4 in_stack_fffffffffffff9c0;
  U32 in_stack_fffffffffffff9c4;
  U32 *in_stack_fffffffffffff9c8;
  BYTE *in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d8;
  U32 in_stack_fffffffffffff9dc;
  U32 *in_stack_fffffffffffff9e0;
  BYTE *in_stack_fffffffffffff9e8;
  BYTE *in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f8;
  U32 in_stack_fffffffffffff9fc;
  BYTE *local_600;
  BYTE *local_530;
  BYTE *local_4b0;
  BYTE *local_4a0;
  BYTE *local_470;
  BYTE *local_448;
  BYTE *local_440;
  uint local_434;
  int local_3f4;
  long local_3f0;
  ulong local_3e8;
  ulong local_3d0;
  int local_358;
  int local_354;
  BYTE *local_330;
  BYTE *local_328;
  size_t local_290;
  size_t local_278;
  size_t local_260;
  ulong local_1e8;
  size_t local_1b8;
  undefined2 local_198;
  void *local_b8;
  BYTE *local_b0;
  void *local_78;
  BYTE *local_70;
  
  pUVar2 = in_RDI->hashTable;
  pUVar3 = in_RDI->chainTable;
  pBVar4 = (in_RDI->window).base;
  iVar11 = (int)pBVar4;
  UVar12 = ZSTD_getLowestPrefixIndex
                     (in_RDI,((int)in_RCX - iVar11) + (int)in_R8,(in_RDI->cParams).windowLog);
  pBVar22 = pBVar4 + UVar12;
  pBVar23 = in_RCX + in_R8;
  pBVar24 = pBVar23 + -8;
  local_354 = *in_RDX;
  local_358 = in_RDX[1];
  pZVar5 = in_RDI->dictMatchState;
  pUVar6 = pZVar5->hashTable;
  pUVar7 = pZVar5->chainTable;
  pBVar8 = (pZVar5->window).base;
  pBVar25 = pBVar8 + (pZVar5->window).dictLimit;
  pBVar9 = (pZVar5->window).nextSrc;
  iVar14 = (int)pBVar9;
  uVar13 = UVar12 - (iVar14 - (int)pBVar8);
  if (in_RDI->prefetchCDictTables != 0) {
    for (local_3d0 = 0; local_3d0 < (ulong)((1L << ((byte)(pZVar5->cParams).hashLog & 0x3f)) << 2);
        local_3d0 = local_3d0 + 0x40) {
    }
    for (local_3e8 = 0; local_3e8 < (ulong)((1L << ((byte)(pZVar5->cParams).chainLog & 0x3f)) << 2);
        local_3e8 = local_3e8 + 0x40) {
    }
  }
  local_328 = in_RCX + (int)(uint)(((int)in_RCX - (int)pBVar22) + (iVar14 - (int)pBVar25) == 0);
  local_330 = in_RCX;
LAB_00a4d048:
  do {
    if (pBVar24 <= local_328) {
      *in_RDX = local_354;
      in_RDX[1] = local_358;
      return (long)pBVar23 - (long)local_330;
    }
    sVar27 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                           in_stack_fffffffffffff9bc);
    switch(0xa4d217) {
    case 0:
      local_1b8 = ZSTD_hash4Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0
                                                ),in_stack_fffffffffffff9bc);
      break;
    case 1:
      local_1b8 = ZSTD_hash5Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0
                                                ),in_stack_fffffffffffff9bc);
      break;
    case 2:
      local_1b8 = ZSTD_hash6Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0
                                                ),in_stack_fffffffffffff9bc);
      break;
    case 3:
      local_1b8 = ZSTD_hash7Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0
                                                ),in_stack_fffffffffffff9bc);
      break;
    case 4:
      local_1b8 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0
                                                ),in_stack_fffffffffffff9bc);
    }
    sVar26 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                           in_stack_fffffffffffff9bc);
    switch(0xa4d41a) {
    case 0:
      local_1e8 = ZSTD_hash4Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0
                                                ),in_stack_fffffffffffff9bc);
      break;
    case 1:
      local_1e8 = ZSTD_hash5Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0
                                                ),in_stack_fffffffffffff9bc);
      break;
    case 2:
      local_1e8 = ZSTD_hash6Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0
                                                ),in_stack_fffffffffffff9bc);
      break;
    case 3:
      local_1e8 = ZSTD_hash7Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0
                                                ),in_stack_fffffffffffff9bc);
      break;
    case 4:
      local_1e8 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0
                                                ),in_stack_fffffffffffff9bc);
    }
    uVar21 = pUVar6[sVar26 >> 8];
    uVar20 = pUVar7[local_1e8 >> 8];
    iVar14 = ZSTD_comparePackedTags((ulong)uVar21,sVar26);
    iVar15 = ZSTD_comparePackedTags((ulong)uVar20,local_1e8);
    local_3f4 = (int)local_328;
    UVar16 = local_3f4 - iVar11;
    uVar1 = pUVar2[sVar27];
    local_434 = pUVar3[local_1b8];
    local_440 = pBVar4 + uVar1;
    local_448 = pBVar4 + local_434;
    uVar17 = (UVar16 + 1) - local_354;
    if (uVar17 < UVar12) {
      local_530 = pBVar8 + (uVar17 - uVar13);
    }
    else {
      local_530 = pBVar4 + uVar17;
    }
    pUVar3[local_1b8] = UVar16;
    pUVar2[sVar27] = UVar16;
    if (2 < (UVar12 - 1) - uVar17) {
      UVar18 = MEM_read32(local_530);
      UVar19 = MEM_read32(local_328 + 1);
      if (UVar18 != UVar19) goto LAB_00a4daf4;
      sVar27 = ZSTD_count_2segments
                         ((BYTE *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                          in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                          (BYTE *)in_stack_fffffffffffff9e0,
                          (BYTE *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
      local_3f0 = sVar27 + 4;
      local_328 = local_328 + 1;
      uVar31 = (long)local_328 - (long)local_330;
      if (pBVar23 + -0x20 < local_330 + uVar31) {
        ZSTD_safecopyLiterals
                  (in_stack_fffffffffffff9d0,(BYTE *)in_stack_fffffffffffff9c8,
                   (BYTE *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                   (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
      }
      else {
        ZSTD_copy16((void *)in_RSI[3],local_330);
        if (0x10 < uVar31) {
          lVar10 = in_RSI[3];
          pvVar30 = (void *)(lVar10 + 0x10);
          ZSTD_copy16(pvVar30,local_330 + 0x10);
          if (0x10 < (long)(uVar31 - 0x10)) {
            local_b8 = (void *)(lVar10 + 0x20);
            do {
              local_b0 = local_330 + 0x20;
              ZSTD_copy16(local_b8,local_b0);
              ZSTD_copy16((void *)((long)local_b8 + 0x10),local_330 + 0x30);
              local_b8 = (void *)((long)local_b8 + 0x20);
              local_330 = local_b0;
            } while (local_b8 < (void *)((long)pvVar30 + (uVar31 - 0x10)));
          }
        }
      }
      in_RSI[3] = uVar31 + in_RSI[3];
      if (0xffff < uVar31) {
        *(undefined4 *)(in_RSI + 9) = 1;
        *(int *)((long)in_RSI + 0x4c) = (int)(in_RSI[1] - *in_RSI >> 3);
      }
      *(short *)(in_RSI[1] + 4) = (short)uVar31;
      *(undefined4 *)in_RSI[1] = 1;
      if (0xffff < sVar27 + 1) {
        *(undefined4 *)(in_RSI + 9) = 2;
        *(int *)((long)in_RSI + 0x4c) = (int)(in_RSI[1] - *in_RSI >> 3);
      }
      *(short *)(in_RSI[1] + 6) = (short)(sVar27 + 1);
      in_RSI[1] = in_RSI[1] + 8;
LAB_00a4eaed:
      local_330 = local_328 + local_3f0;
      local_328 = local_330;
      if (local_330 <= pBVar24) {
        sVar27 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0)
                               ,in_stack_fffffffffffff9bc);
        pUVar2[sVar27] = UVar16 + 2;
        sVar27 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0)
                               ,in_stack_fffffffffffff9bc);
        pUVar2[sVar27] = ((int)local_330 + -2) - iVar11;
        switch(0xa4ee69) {
        case 0:
          local_260 = ZSTD_hash4Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,
                                                     in_stack_fffffffffffff9c0),
                                    in_stack_fffffffffffff9bc);
          break;
        case 1:
          local_260 = ZSTD_hash5Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,
                                                     in_stack_fffffffffffff9c0),
                                    in_stack_fffffffffffff9bc);
          break;
        case 2:
          local_260 = ZSTD_hash6Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,
                                                     in_stack_fffffffffffff9c0),
                                    in_stack_fffffffffffff9bc);
          break;
        case 3:
          local_260 = ZSTD_hash7Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,
                                                     in_stack_fffffffffffff9c0),
                                    in_stack_fffffffffffff9bc);
          break;
        case 4:
          local_260 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,
                                                     in_stack_fffffffffffff9c0),
                                    in_stack_fffffffffffff9bc);
        }
        pUVar3[local_260] = UVar16 + 2;
        switch(0xa4ef89) {
        case 0:
          local_278 = ZSTD_hash4Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,
                                                     in_stack_fffffffffffff9c0),
                                    in_stack_fffffffffffff9bc);
          break;
        case 1:
          local_278 = ZSTD_hash5Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,
                                                     in_stack_fffffffffffff9c0),
                                    in_stack_fffffffffffff9bc);
          break;
        case 2:
          local_278 = ZSTD_hash6Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,
                                                     in_stack_fffffffffffff9c0),
                                    in_stack_fffffffffffff9bc);
          break;
        case 3:
          local_278 = ZSTD_hash7Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,
                                                     in_stack_fffffffffffff9c0),
                                    in_stack_fffffffffffff9bc);
          break;
        case 4:
          local_278 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,
                                                     in_stack_fffffffffffff9c0),
                                    in_stack_fffffffffffff9bc);
        }
        pUVar3[local_278] = ((int)local_330 + -1) - iVar11;
        for (; iVar14 = local_358, local_330 = local_328, local_328 <= pBVar24;
            local_328 = local_328 + sVar27 + 4) {
          UVar16 = (int)local_328 - iVar11;
          uVar21 = UVar16 - local_358;
          if (uVar21 < UVar12) {
            local_600 = pBVar8 + ((ulong)uVar21 - (ulong)uVar13);
          }
          else {
            local_600 = pBVar4 + uVar21;
          }
          if ((UVar12 - 1) - uVar21 < 3) break;
          in_stack_fffffffffffff9fc = MEM_read32(local_600);
          UVar18 = MEM_read32(local_328);
          if (in_stack_fffffffffffff9fc != UVar18) break;
          in_stack_fffffffffffff9f0 = pBVar23;
          if (uVar21 < UVar12) {
            in_stack_fffffffffffff9f0 = pBVar9;
          }
          sVar27 = ZSTD_count_2segments
                             ((BYTE *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                              in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                              (BYTE *)in_stack_fffffffffffff9e0,
                              (BYTE *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8))
          ;
          local_358 = local_354;
          local_354 = iVar14;
          if (pBVar23 + -0x20 < local_328) {
            ZSTD_safecopyLiterals
                      (in_stack_fffffffffffff9d0,(BYTE *)in_stack_fffffffffffff9c8,
                       (BYTE *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                       (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
          }
          else {
            ZSTD_copy16((void *)in_RSI[3],local_328);
          }
          in_RSI[3] = in_RSI[3];
          *(undefined2 *)(in_RSI[1] + 4) = 0;
          *(undefined4 *)in_RSI[1] = 1;
          if (0xffff < sVar27 + 1) {
            *(undefined4 *)(in_RSI + 9) = 2;
            *(int *)((long)in_RSI + 0x4c) = (int)(in_RSI[1] - *in_RSI >> 3);
          }
          local_198 = (undefined2)(sVar27 + 1);
          *(undefined2 *)(in_RSI[1] + 6) = local_198;
          in_RSI[1] = in_RSI[1] + 8;
          in_stack_fffffffffffff9e8 = (BYTE *)0x3;
          in_stack_fffffffffffff9dc = UVar16;
          in_stack_fffffffffffff9e0 = pUVar3;
          switch(0xa4f621) {
          case 0:
            local_290 = ZSTD_hash4Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,
                                                       in_stack_fffffffffffff9c0),
                                      in_stack_fffffffffffff9bc);
            break;
          case 1:
            local_290 = ZSTD_hash5Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,
                                                       in_stack_fffffffffffff9c0),
                                      in_stack_fffffffffffff9bc);
            break;
          case 2:
            local_290 = ZSTD_hash6Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,
                                                       in_stack_fffffffffffff9c0),
                                      in_stack_fffffffffffff9bc);
            break;
          case 3:
            local_290 = ZSTD_hash7Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,
                                                       in_stack_fffffffffffff9c0),
                                      in_stack_fffffffffffff9bc);
            break;
          case 4:
            local_290 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,
                                                       in_stack_fffffffffffff9c0),
                                      in_stack_fffffffffffff9bc);
          }
          in_stack_fffffffffffff9e0[local_290] = in_stack_fffffffffffff9dc;
          in_stack_fffffffffffff9d0 = (BYTE *)0x4;
          in_stack_fffffffffffff9c8 = pUVar2;
          sVar26 = ZSTD_hash8Ptr((void *)CONCAT44(UVar16,in_stack_fffffffffffff9c0),
                                 in_stack_fffffffffffff9bc);
          in_stack_fffffffffffff9c8[sVar26] = UVar16;
          in_stack_fffffffffffff9c4 = UVar16;
        }
      }
      goto LAB_00a4d048;
    }
LAB_00a4daf4:
    if (UVar12 < uVar1) {
      UVar28 = MEM_read64(local_440);
      UVar29 = MEM_read64(local_328);
      if (UVar28 != UVar29) goto LAB_00a4dde2;
      sVar27 = ZSTD_count((BYTE *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                          in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
      local_3f0 = sVar27 + 8;
      local_3f4 = local_3f4 - (int)local_440;
      while( true ) {
        bVar32 = false;
        if (local_330 < local_328 && pBVar22 < local_440) {
          bVar32 = local_328[-1] == local_440[-1];
        }
        if (!bVar32) break;
        local_328 = local_328 + -1;
        local_440 = local_440 + -1;
        local_3f0 = local_3f0 + 1;
      }
LAB_00a4e6c7:
      local_358 = local_354;
      local_354 = local_3f4;
      uVar31 = (long)local_328 - (long)local_330;
      if (pBVar23 + -0x20 < local_330 + uVar31) {
        ZSTD_safecopyLiterals
                  (in_stack_fffffffffffff9d0,(BYTE *)in_stack_fffffffffffff9c8,
                   (BYTE *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                   (BYTE *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
      }
      else {
        ZSTD_copy16((void *)in_RSI[3],local_330);
        if (0x10 < uVar31) {
          lVar10 = in_RSI[3];
          pvVar30 = (void *)(lVar10 + 0x10);
          ZSTD_copy16(pvVar30,local_330 + 0x10);
          if (0x10 < (long)(uVar31 - 0x10)) {
            local_78 = (void *)(lVar10 + 0x20);
            do {
              local_70 = local_330 + 0x20;
              ZSTD_copy16(local_78,local_70);
              ZSTD_copy16((void *)((long)local_78 + 0x10),local_330 + 0x30);
              local_78 = (void *)((long)local_78 + 0x20);
              local_330 = local_70;
            } while (local_78 < (void *)((long)pvVar30 + (uVar31 - 0x10)));
          }
        }
      }
      in_RSI[3] = uVar31 + in_RSI[3];
      if (0xffff < uVar31) {
        *(undefined4 *)(in_RSI + 9) = 1;
        *(int *)((long)in_RSI + 0x4c) = (int)(in_RSI[1] - *in_RSI >> 3);
      }
      *(short *)(in_RSI[1] + 4) = (short)uVar31;
      *(int *)in_RSI[1] = local_3f4 + 3;
      if (0xffff < local_3f0 - 3U) {
        *(undefined4 *)(in_RSI + 9) = 2;
        *(int *)((long)in_RSI + 0x4c) = (int)(in_RSI[1] - *in_RSI >> 3);
      }
      *(short *)(in_RSI[1] + 6) = (short)(local_3f0 - 3U);
      in_RSI[1] = in_RSI[1] + 8;
      goto LAB_00a4eaed;
    }
    if (iVar14 != 0) {
      uVar21 = uVar21 >> 8;
      local_470 = pBVar8 + uVar21;
      if (pBVar25 < local_470) {
        UVar28 = MEM_read64(local_470);
        UVar29 = MEM_read64(local_328);
        if (UVar28 == UVar29) {
          sVar27 = ZSTD_count_2segments
                             ((BYTE *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                              in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                              (BYTE *)in_stack_fffffffffffff9e0,
                              (BYTE *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8))
          ;
          local_3f0 = sVar27 + 8;
          local_3f4 = (UVar16 - uVar21) - uVar13;
          while( true ) {
            bVar32 = false;
            if (local_330 < local_328 && pBVar25 < local_470) {
              bVar32 = local_328[-1] == local_470[-1];
            }
            if (!bVar32) break;
            local_328 = local_328 + -1;
            local_470 = local_470 + -1;
            local_3f0 = local_3f0 + 1;
          }
          goto LAB_00a4e6c7;
        }
      }
    }
LAB_00a4dde2:
    if (UVar12 < local_434) {
      UVar18 = MEM_read32(local_448);
      UVar19 = MEM_read32(local_328);
      if (UVar18 == UVar19) {
LAB_00a4deee:
        sVar27 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0)
                               ,in_stack_fffffffffffff9bc);
        sVar26 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0)
                               ,in_stack_fffffffffffff9bc);
        uVar21 = pUVar2[sVar27];
        uVar20 = pUVar6[sVar26 >> 8];
        iVar14 = ZSTD_comparePackedTags((ulong)uVar20,sVar26);
        local_4a0 = pBVar4 + uVar21;
        pUVar2[sVar27] = UVar16 + 1;
        if (UVar12 < uVar21) {
          UVar28 = MEM_read64(local_4a0);
          UVar29 = MEM_read64(local_328 + 1);
          if (UVar28 == UVar29) {
            sVar27 = ZSTD_count((BYTE *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8
                                                ),in_stack_fffffffffffff9f0,
                                in_stack_fffffffffffff9e8);
            local_3f0 = sVar27 + 8;
            local_328 = local_328 + 1;
            local_3f4 = (int)local_328 - (int)local_4a0;
            while( true ) {
              bVar32 = false;
              if (local_330 < local_328 && pBVar22 < local_4a0) {
                bVar32 = local_328[-1] == local_4a0[-1];
              }
              if (!bVar32) break;
              local_328 = local_328 + -1;
              local_4a0 = local_4a0 + -1;
              local_3f0 = local_3f0 + 1;
            }
            goto LAB_00a4e6c7;
          }
        }
        else if (iVar14 != 0) {
          uVar20 = uVar20 >> 8;
          local_4b0 = pBVar8 + uVar20;
          if (pBVar25 < local_4b0) {
            UVar28 = MEM_read64(local_4b0);
            UVar29 = MEM_read64(local_328 + 1);
            if (UVar28 == UVar29) {
              sVar27 = ZSTD_count_2segments
                                 ((BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                   in_stack_fffffffffffff9f8),
                                  in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                                  (BYTE *)in_stack_fffffffffffff9e0,
                                  (BYTE *)CONCAT44(in_stack_fffffffffffff9dc,
                                                   in_stack_fffffffffffff9d8));
              local_3f0 = sVar27 + 8;
              local_328 = local_328 + 1;
              local_3f4 = ((UVar16 + 1) - uVar20) - uVar13;
              while( true ) {
                bVar32 = false;
                if (local_330 < local_328 && pBVar25 < local_4b0) {
                  bVar32 = local_328[-1] == local_4b0[-1];
                }
                if (!bVar32) break;
                local_328 = local_328 + -1;
                local_4b0 = local_4b0 + -1;
                local_3f0 = local_3f0 + 1;
              }
              goto LAB_00a4e6c7;
            }
          }
        }
        if (local_434 < UVar12) {
          sVar27 = ZSTD_count_2segments
                             ((BYTE *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                              in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                              (BYTE *)in_stack_fffffffffffff9e0,
                              (BYTE *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8))
          ;
          local_3f0 = sVar27 + 4;
          local_3f4 = UVar16 - local_434;
          while( true ) {
            bVar32 = false;
            if (local_330 < local_328 && pBVar25 < local_448) {
              bVar32 = local_328[-1] == local_448[-1];
            }
            if (!bVar32) break;
            local_328 = local_328 + -1;
            local_448 = local_448 + -1;
            local_3f0 = local_3f0 + 1;
          }
        }
        else {
          sVar27 = ZSTD_count((BYTE *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                              in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
          local_3f0 = sVar27 + 4;
          local_3f4 = local_3f4 - (int)local_448;
          while( true ) {
            bVar32 = false;
            if (local_330 < local_328 && pBVar22 < local_448) {
              bVar32 = local_328[-1] == local_448[-1];
            }
            if (!bVar32) break;
            local_328 = local_328 + -1;
            local_448 = local_448 + -1;
            local_3f0 = local_3f0 + 1;
          }
        }
        goto LAB_00a4e6c7;
      }
    }
    else if (iVar15 != 0) {
      uVar20 = uVar20 >> 8;
      local_448 = pBVar8 + uVar20;
      local_434 = uVar20 + uVar13;
      if (pBVar25 < local_448) {
        UVar18 = MEM_read32(local_448);
        UVar19 = MEM_read32(local_328);
        if (UVar18 == UVar19) goto LAB_00a4deee;
      }
    }
    local_328 = local_328 + ((long)local_328 - (long)local_330 >> 8) + 1;
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_doubleFast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_noDict_4(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_doubleFast_noDict_5(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_doubleFast_noDict_6(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_doubleFast_noDict_7(ms, seqStore, rep, src, srcSize);
    }
}